

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ExceptionCode *pEVar4;
  StdioConfiguration SVar5;
  StdioConfiguration SVar6;
  char *__s;
  bool bVar7;
  int fd;
  ostream *poVar8;
  cmUVProcessChainBuilder *this_00;
  size_t sVar9;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  StdioConfiguration SVar10;
  StdioConfiguration *pSVar11;
  ulong uVar12;
  Status *this_01;
  long *plVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  cmProcessOutput processOutput;
  cmUVProcessChain chain;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  uv_pipe_ptr outputStream;
  size_type tick_len;
  cmUVProcessChainBuilder builder;
  size_type tick_line_len;
  size_type tick;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  undefined1 local_319;
  undefined1 local_318 [16];
  StdioConfiguration local_308;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  long local_2c8 [2];
  uv_handle_ptr_base_<uv_pipe_s> local_2b8;
  undefined8 local_2a0;
  cmUVProcessChainBuilder local_298;
  ExceptionCode *local_238;
  pointer local_230;
  pointer local_228;
  StdioConfiguration local_220;
  StdioConfiguration local_218;
  char *local_210;
  undefined8 local_208;
  undefined8 local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0;
  undefined1 local_1c0 [376];
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = timeout.__r;
  local_48._12_4_ = in_XMM0_Dd;
  local_210 = dir;
  cmSystemTools::ParseArguments(&local_1f8,command);
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_230 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_228 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Run command:",0xc);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x444,(char *)local_298.Stdio._M_elems[0],false);
    local_318._8_8_ = this;
    local_238 = (ExceptionCode *)retVal;
    local_220 = (StdioConfiguration)ofs;
    local_218 = (StdioConfiguration)output;
    if (local_298.Stdio._M_elems[0] != (StdioConfiguration)(local_298.Stdio._M_elems + 2)) {
      operator_delete((void *)local_298.Stdio._M_elems[0],(long)local_298.Stdio._M_elems[2] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    if (local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_1f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," \"",2);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c0,(pbVar14->_M_dataplus)._M_p,
                            pbVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
        std::__cxx11::stringbuf::str();
        Log((cmCTest *)local_318._8_8_,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x446,(char *)local_298.Stdio._M_elems[0],false);
        if (local_298.Stdio._M_elems[0] != (StdioConfiguration)(local_298.Stdio._M_elems + 2)) {
          operator_delete((void *)local_298.Stdio._M_elems[0],(long)local_298.Stdio._M_elems[2] + 1)
          ;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 !=
               local_1f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::ios::widen((char)(ostringstream *)local_1c0 +
                    (char)*(_func_int **)(local_1c0._0_8_ + -0x18));
    uVar2 = local_318._8_8_;
    std::ostream::put((char)local_1c0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log((cmCTest *)uVar2,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x448,(char *)local_298.Stdio._M_elems[0],false);
    __s = local_210;
    if (local_298.Stdio._M_elems[0] != (StdioConfiguration)(local_298.Stdio._M_elems + 2)) {
      operator_delete((void *)local_298.Stdio._M_elems[0],(long)local_298.Stdio._M_elems[2] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_298);
    this_00 = cmUVProcessChainBuilder::AddCommand(&local_298,&local_1f8);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    if (__s != (char *)0x0) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,__s,__s + sVar9);
      cmUVProcessChainBuilder::SetWorkingDirectory(&local_298,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_318);
    local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2b8.handle.super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_318);
    ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)&local_2b8,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       ((uv_handle_ptr_<uv_pipe_s> *)&local_2b8);
    fd = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_318);
    uv_pipe_open(handle,fd);
    local_200 = 0;
    local_2a0 = 0x400;
    local_208 = 0x32;
    cmProcessOutput::cmProcessOutput((cmProcessOutput *)&local_319,encoding,0x400);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"   Each . represents ",0x15);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes of output\n    ",0x15);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log((cmCTest *)local_318._8_8_,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x45f,(char *)CONCAT44(local_300._4_4_,local_300.first),false);
    if ((size_type *)CONCAT44(local_300._4_4_,local_300.first) != &local_300.second._M_string_length
       ) {
      operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300.first),
                      (ulong)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_300.second._M_string_length)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)&local_2b8);
    SVar10 = (StdioConfiguration)operator_new(0x58);
    *(undefined8 *)((long)SVar10 + 0x40) = 0;
    *(_Manager_type *)((long)SVar10 + 0x48) = (_Manager_type)0x0;
    *(_Invoker_type *)((long)SVar10 + 0x30) = (_Invoker_type)0x0;
    *(undefined8 *)&(((function<void_()> *)((long)SVar10 + 0x38))->super__Function_base)._M_functor
         = 0;
    *(undefined8 *)((long)SVar10 + 0x20) = 0;
    *(_Manager_type *)((long)SVar10 + 0x28) = (_Manager_type)0x0;
    *(pointer *)((long)SVar10 + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &(((function<void_(std::vector<char,_std::allocator<char>_>)> *)((long)SVar10 + 0x18))->
      super__Function_base)._M_functor = 0;
    *(undefined8 *)SVar10 = 0;
    *(pointer *)((long)SVar10 + 8) = (pointer)0x0;
    *(_Invoker_type *)((long)SVar10 + 0x50) = (_Invoker_type)0x0;
    local_308 = SVar10;
    pSVar11 = (StdioConfiguration *)operator_new(0x38);
    SVar6 = local_218;
    SVar5 = local_220;
    uVar2 = local_318._8_8_;
    pSVar11->Type = local_318._8_4_;
    pSVar11->FileDescriptor = local_318._12_4_;
    pSVar11[1] = (StdioConfiguration)&local_319;
    pSVar11[2] = local_218;
    pSVar11[3] = (StdioConfiguration)&local_200;
    pSVar11[4] = (StdioConfiguration)&local_2a0;
    pSVar11[5] = (StdioConfiguration)&local_208;
    pSVar11[6] = local_220;
    *(StdioConfiguration **)
     &(((function<void_(std::vector<char,_std::allocator<char>_>)> *)((long)SVar10 + 0x18))->
      super__Function_base)._M_functor = pSVar11;
    *(undefined8 *)((long)SVar10 + 0x20) = 0;
    *(code **)((long)SVar10 + 0x28) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_manager;
    *(code **)((long)SVar10 + 0x30) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_invoke;
    pSVar11 = (StdioConfiguration *)operator_new(0x20);
    uVar3 = local_318._8_8_;
    local_318._8_4_ = (undefined4)uVar2;
    local_318._12_4_ = SUB84(uVar2,4);
    pSVar11->Type = local_318._8_4_;
    pSVar11->FileDescriptor = local_318._12_4_;
    pSVar11[1] = (StdioConfiguration)&local_319;
    pSVar11[2] = SVar6;
    pSVar11[3] = SVar5;
    *(StdioConfiguration **)
     &(((function<void_()> *)((long)SVar10 + 0x38))->super__Function_base)._M_functor = pSVar11;
    *(undefined8 *)((long)SVar10 + 0x40) = 0;
    *(code **)((long)SVar10 + 0x48) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_manager;
    *(code **)((long)SVar10 + 0x50) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_invoke;
    stream->data = (void *)SVar10;
    local_318._8_8_ = uVar3;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar12 = (ulong)((double)local_48._0_8_ * 1000.0);
    bVar7 = cmUVProcessChain::Wait
                      ((cmUVProcessChain *)local_318,
                       (long)((double)local_48._0_8_ * 1000.0 - 9.223372036854776e+18) &
                       (long)uVar12 >> 0x3f | uVar12);
    psVar1 = &local_300.second._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    uVar2 = local_318._8_8_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0," Size of output: ",0x11);
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (local_1c0,
                        (int)((((double)CONCAT44(0x45300000,
                                                 (int)(*(size_type *)((long)SVar6 + 8) >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)*(size_type *)((long)SVar6 + 8)) -
                              4503599627370496.0)) * 0.0009765625));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"K",1);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log((cmCTest *)uVar2,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x48b,(char *)CONCAT44(local_300._4_4_,local_300.first),false);
    if ((size_type *)CONCAT44(local_300._4_4_,local_300.first) != psVar1) {
      operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300.first),
                      (ulong)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_300.second._M_string_length)->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    if (bVar7) {
      this_01 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_318,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_318 + 0x18),this_01);
      pEVar4 = local_238;
      if (local_300.first == None) {
        *local_238 = (ExceptionCode)this_01->ExitStatus;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"Command exited with the value: ",0x1f);
        plVar13 = (long *)std::ostream::operator<<(local_1c0,*pEVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
        std::ostream::put((char)plVar13);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log((cmCTest *)uVar2,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x494,(char *)local_2d8._M_allocated_capacity,false);
      }
      else if (local_300.first == Spawn) {
        std::__cxx11::string::append((char *)SVar6);
        std::__cxx11::string::_M_append((char *)SVar6,(ulong)local_300.second._M_dataplus._M_p);
        std::__cxx11::string::append((char *)SVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"There was an error: ",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c0,local_300.second._M_dataplus._M_p,
                            local_300.second._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log((cmCTest *)uVar2,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x49b,(char *)local_2d8._M_allocated_capacity,false);
      }
      else {
        *local_238 = local_300.first;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"There was an exception: ",0x18);
        plVar13 = (long *)std::ostream::operator<<(local_1c0,*pEVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
        std::ostream::put((char)plVar13);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log((cmCTest *)uVar2,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x4a0,(char *)local_2d8._M_allocated_capacity,false);
      }
      if ((long *)local_2d8._M_allocated_capacity != local_2c8) {
        operator_delete((void *)local_2d8._M_allocated_capacity,local_2c8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.second._M_dataplus._M_p != &local_300.second.field_2) {
        operator_delete(local_300.second._M_dataplus._M_p,
                        (ulong)(local_300.second.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"There was a timeout",0x13);
      std::ios::widen((char)(ostream *)local_1c0 + (char)*(_func_int **)(local_1c0._0_8_ + -0x18));
      std::ostream::put((char)local_1c0);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log((cmCTest *)uVar2,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4a4,(char *)CONCAT44(local_300._4_4_,local_300.first),false);
      if ((size_type *)CONCAT44(local_300._4_4_,local_300.first) != psVar1) {
        operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300.first),
                        (ulong)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_300.second._M_string_length)->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
      std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
    }
    if (local_308 != (StdioConfiguration)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)(local_318 + 0x10),
                 (cmUVStreamReadHandle *)local_308);
    }
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_2b8);
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.WorkingDirectory._M_dataplus._M_p != &local_298.WorkingDirectory.field_2) {
      operator_delete(local_298.WorkingDirectory._M_dataplus._M_p,
                      local_298.WorkingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_298.Processes);
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_228;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_230;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return local_1f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_1f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                             int* retVal, const char* dir, cmDuration timeout,
                             std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (auto const& arg : args) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args).SetMergedBuiltinStreams();
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  cmProcessOutput processOutput(encoding);
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tick, &tick_len, &tick_line_len,
     &ofs](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      for (char& cc : strdata) {
        if (cc == 0) {
          cc = '\n';
        }
      }
      output.append(strdata);
      while (output.size() > (tick * tick_len)) {
        tick++;
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
        if (tick % tick_line_len == 0 && tick > 0) {
          cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                     "  Size: " << int((double(output.size()) / 1024.0) + 1)
                                << "K\n    " << std::flush);
        }
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (ofs) {
        ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &output, &ofs]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        output.append(strdata);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (ofs) {
          ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
        }
      }
    });

  bool finished = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  if (finished) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   "Command exited with the value: " << *retVal << std::endl);
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        output += "\n*** ERROR executing: ";
        output += exception.second;
        output += "\n***The build process failed.";
        cmCTestLog(this, ERROR_MESSAGE,
                   "There was an error: " << exception.second << std::endl);
        break;
      default:
        *retVal = static_cast<int>(exception.first);
        cmCTestLog(this, WARNING,
                   "There was an exception: " << *retVal << std::endl);
        break;
    }
  } else {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  }

  return true;
}